

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int UnixFile_Lock(void *pUserData,int lock_type)

{
  int iVar1;
  char cVar2;
  
  cVar2 = '\b';
  if (-1 < lock_type) {
    cVar2 = (lock_type == 1) + '\x01';
  }
  iVar1 = flock(pUserData,cVar2);
  return -(uint)(iVar1 != 0);
}

Assistant:

static int UnixFile_Lock(void *pUserData, int lock_type)
{
	int fd = SX_PTR_TO_INT(pUserData);
	int rc = JX9_OK; /* cc warning */
	if( lock_type < 0 ){
		/* Unlock the file */
		rc = flock(fd, LOCK_UN);
	}else{
		if( lock_type == 1 ){
			/* Exculsive lock */
			rc = flock(fd, LOCK_EX);
		}else{
			/* Shared lock */
			rc = flock(fd, LOCK_SH);
		}
	}
	return !rc ? JX9_OK : -1;
}